

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

void Cloud_Restart(CloudManager *dd)

{
  CloudSign CVar1;
  int iVar2;
  CloudNode **ppCVar3;
  long lVar4;
  
  CVar1 = dd->one->s;
  if (CVar1 == dd->nSignCur) {
    dd->nSignCur = dd->nSignCur + 1;
    dd->one->s = CVar1 + 1;
    iVar2 = dd->nVars;
    if (0 < (long)iVar2) {
      ppCVar3 = dd->vars;
      lVar4 = 0;
      do {
        ppCVar3[lVar4]->s = ppCVar3[lVar4]->s + 1;
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
    dd->nNodesCur = iVar2 + 1;
    return;
  }
  __assert_fail("dd->one->s == dd->nSignCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/cloud.c"
                ,0xa9,"void Cloud_Restart(CloudManager *)");
}

Assistant:

void Cloud_Restart( CloudManager * dd )
{
    int i;
    assert( dd->one->s == dd->nSignCur );
    dd->nSignCur++;
    dd->one->s++;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]->s++;
    dd->nNodesCur = 1 + dd->nVars;
}